

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall wabt::SharedValidator::OnElse(SharedValidator *this,Location *loc)

{
  Result RVar1;
  Result RVar2;
  
  RVar1 = TypeChecker::OnElse(&this->typechecker_);
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = RVar1.enum_ == Error;
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::OnElse(const Location& loc) {
  // Don't call CheckInstr or update expr_loc_ here because if we fail we want
  // the last expression in the If block to be reported as the error location,
  // not the else itself.
  Result result = Result::Ok;
  result |= typechecker_.OnElse();
  return result;
}